

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent,QScreen*,double,double>
               (QScreen *args,double args_1,double args_2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined1 uVar4;
  int *piVar5;
  long in_FS_OFFSET;
  WindowSystemEvent local_50;
  int *local_38;
  QScreen *local_30;
  double local_28;
  double local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::ScreenLogicalDotsPerInchEvent,QScreen*,double,double>
              (args,args_1,args_2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_0032fa06;
  }
  local_50.type = ScreenLogicalDotsPerInch;
  local_50.flags = 0;
  local_50.eventAccepted = true;
  local_50._17_7_ = 0xaaaaaaaaaaaaaa;
  local_50._vptr_WindowSystemEvent = (_func_int **)&PTR__ScreenLogicalDotsPerInchEvent_007d9008;
  if (args == (QScreen *)0x0) {
    local_38 = (int *)0x0;
  }
  else {
    local_38 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  local_30 = args;
  local_28 = args_1;
  local_20 = args_2;
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(&local_50);
LAB_0032f9c3:
    uVar4 = local_50.eventAccepted;
  }
  else {
    iVar3 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&local_50);
    if ((char)iVar3 != '\0') goto LAB_0032f9c3;
    uVar4 = 0;
  }
  local_50._vptr_WindowSystemEvent = (_func_int **)&PTR__ScreenLogicalDotsPerInchEvent_007d9008;
  if (local_38 != (int *)0x0) {
    LOCK();
    *local_38 = *local_38 + -1;
    UNLOCK();
    if (*local_38 == 0) {
      piVar5 = local_38;
      if (local_38 == (int *)0x0) {
        piVar5 = (int *)0x0;
      }
      operator_delete(piVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar4;
  }
LAB_0032fa06:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}